

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  double dVar6;
  double dVar7;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  dVar7 = (pFVar2->fadexpr_).left_.constant_ + pFVar4->val_;
  dVar6 = (pFVar1->fadexpr_).left_.constant_ + pFVar3->val_;
  pFVar5 = (this->right_->fadexpr_).right_;
  return dVar6 * dVar7 * (pFVar5->dx_).ptr_to_data[i] +
         ((this->right_->fadexpr_).left_.constant_ + pFVar5->val_) *
         ((pFVar3->dx_).ptr_to_data[i] * dVar7 + (pFVar4->dx_).ptr_to_data[i] * dVar6);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}